

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_ForwardThrust(player_t *player,DAngle *angle,double move)

{
  int iVar1;
  APlayerPawn *pAVar2;
  double dVar3;
  double dVar4;
  DAngle local_18;
  
  pAVar2 = player->mo;
  if (((pAVar2->super_AActor).waterlevel != 0) ||
     (((pAVar2->super_AActor).flags.Value & 0x200) != 0)) {
    dVar3 = (pAVar2->super_AActor).Angles.Pitch.Degrees;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar3 = FFastTrig::sin(&fasttrig,dVar3 * 11930464.711111112 + 6755399441055744.0);
      dVar3 = dVar3 * move;
      pAVar2 = player->mo;
      iVar1 = (pAVar2->super_AActor).waterlevel;
      if (iVar1 != 0) {
        dVar4 = 0.0;
        if (1 < iVar1) {
          dVar4 = dVar3;
        }
        dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar3 |
                        (ulong)dVar4 & -(ulong)(dVar3 < 0.0));
      }
      (pAVar2->super_AActor).Vel.Z = (pAVar2->super_AActor).Vel.Z - dVar3;
      dVar3 = FFastTrig::cos(&fasttrig,dVar3);
      move = move * dVar3;
      pAVar2 = player->mo;
    }
  }
  local_18 = (DAngle)angle->Degrees;
  AActor::Thrust(&pAVar2->super_AActor,&local_18,move);
  return;
}

Assistant:

void P_ForwardThrust (player_t *player, DAngle angle, double move)
{
	if ((player->mo->waterlevel || (player->mo->flags & MF_NOGRAVITY))
		&& player->mo->Angles.Pitch != 0)
	{
		double zpush = move * player->mo->Angles.Pitch.Sin();
		if (player->mo->waterlevel && player->mo->waterlevel < 2 && zpush < 0)
			zpush = 0;
		player->mo->Vel.Z -= zpush;
		move *= player->mo->Angles.Pitch.Cos();
	}
	player->mo->Thrust(angle, move);
}